

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch2.h
# Opt level: O0

bool hashSearch2<unsigned_short>
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *keys,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *vals,string *hash_str,string *map_name,string *default_value,uint8_t expansion,
               uint8_t reduction,bool nonKeyLookups)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  size_t n1_00;
  size_t n2_00;
  string local_a0;
  ushort local_7c;
  ushort local_7a;
  byte abStack_78 [6];
  SeedType seed;
  uint8_t primes [32];
  size_t n2;
  size_t n1;
  bool nonKeyLookups_local;
  uint8_t expansion_local;
  string *default_value_local;
  string *map_name_local;
  string *hash_str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vals_local;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *keys_local;
  
  sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(keys);
  if (sVar2 < 2) {
    __assert_fail("keys.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch2.h"
                  ,0xdc,
                  "bool hashSearch2(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = unsigned short]"
                 );
  }
  bVar1 = hasDuplicates<unsigned_short>(keys);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(vals);
    sVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(keys);
    if (sVar2 != sVar3) {
      __assert_fail("vals.size() == keys.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch2.h"
                    ,0xde,
                    "bool hashSearch2(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = unsigned short]"
                   );
    }
    sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(keys);
    n1_00 = getModulusBitmask((sVar2 * expansion) / (ulong)reduction);
    sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(keys);
    n2_00 = getModulusBitmask(sVar2);
    _abStack_78 = 0xd0b070503020100;
    builtin_memcpy(primes,"\x11\x13\x17\x1d\x1f%)+/5;=CGIOSYaegkmq",0x18);
    local_7a = 0;
    while( true ) {
      if (0x1f < local_7a) {
        return false;
      }
      local_7c = (ushort)primes[(ulong)local_7a - 8];
      std::__cxx11::string::string((string *)&local_a0,(string *)map_name);
      bVar1 = testSeed<unsigned_short>
                        (keys,&local_7c,n1_00,n2_00,vals,hash_str,&local_a0,default_value,
                         nonKeyLookups);
      std::__cxx11::string::~string((string *)&local_a0);
      if (bVar1) break;
      local_7a = local_7a + 1;
    }
    return true;
  }
  __assert_fail("!hasDuplicates(keys)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch2.h"
                ,0xdd,
                "bool hashSearch2(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = unsigned short]"
               );
}

Assistant:

bool hashSearch2(const std::vector<KeyType>& keys,
                 const std::vector<std::string>& vals,
                 std::string& hash_str,
                 std::string map_name = "PoifectMap",
                 std::string default_value = "",
                 uint8_t expansion = 1,
                 uint8_t reduction = 1,
                 bool nonKeyLookups = true){
    assert(keys.size() > 1);
    assert(!hasDuplicates(keys));
    assert(vals.size() == keys.size());

    const size_t n1 = getModulusBitmask(keys.size()*expansion/reduction);
    const size_t n2 = getModulusBitmask(keys.size());

    const uint8_t primes[32] = {  0,   1,   2,   3,   5,
                                  7,  11,  13,  17,  19,
                                 23,  29,  31,  37,  41,
                                 43,  47,  53,  59,  61,
                                 67,  71,  73,  79,  83,
                                 89,  97, 101, 103, 107,
                                109, 113};

    for(SeedType seed = 0; seed < 32; seed++)
        if(testSeed<KeyType>(keys, primes[seed], n1, n2, vals, hash_str, map_name, default_value, nonKeyLookups))
            return true;

    return false;
}